

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCData_Sequence_Parser.cpp
# Opt level: O0

void __thiscall
ASDCP::DCData::SequenceParser::h__SequenceParser::h__SequenceParser(h__SequenceParser *this)

{
  Rational local_24 [2];
  h__SequenceParser *local_10;
  h__SequenceParser *this_local;
  
  this->m_FramesRead = 0;
  local_10 = this;
  Rational::Rational(&this->m_PictureRate);
  FileList::FileList(&this->m_FileList);
  std::
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  _List_iterator(&this->m_CurrentFile);
  BytestreamParser::BytestreamParser(&this->m_Parser);
  DCDataDescriptor::DCDataDescriptor(&this->m_DDesc);
  (this->m_DDesc).DataEssenceCoding[0] = '\0';
  (this->m_DDesc).DataEssenceCoding[1] = '\0';
  (this->m_DDesc).DataEssenceCoding[2] = '\0';
  (this->m_DDesc).DataEssenceCoding[3] = '\0';
  (this->m_DDesc).DataEssenceCoding[4] = '\0';
  (this->m_DDesc).DataEssenceCoding[5] = '\0';
  (this->m_DDesc).DataEssenceCoding[6] = '\0';
  (this->m_DDesc).DataEssenceCoding[7] = '\0';
  (this->m_DDesc).DataEssenceCoding[8] = '\0';
  (this->m_DDesc).DataEssenceCoding[9] = '\0';
  (this->m_DDesc).DataEssenceCoding[10] = '\0';
  (this->m_DDesc).DataEssenceCoding[0xb] = '\0';
  (this->m_DDesc).DataEssenceCoding[0xc] = '\0';
  (this->m_DDesc).DataEssenceCoding[0xd] = '\0';
  (this->m_DDesc).DataEssenceCoding[0xe] = '\0';
  (this->m_DDesc).DataEssenceCoding[0xf] = '\0';
  (this->m_DDesc).AssetID[4] = '\0';
  (this->m_DDesc).AssetID[5] = '\0';
  (this->m_DDesc).AssetID[6] = '\0';
  (this->m_DDesc).AssetID[7] = '\0';
  (this->m_DDesc).AssetID[8] = '\0';
  (this->m_DDesc).AssetID[9] = '\0';
  (this->m_DDesc).AssetID[10] = '\0';
  (this->m_DDesc).AssetID[0xb] = '\0';
  *(undefined8 *)((this->m_DDesc).AssetID + 0xc) = 0;
  (this->m_DDesc).EditRate.Numerator = 0;
  (this->m_DDesc).EditRate.Denominator = 0;
  (this->m_DDesc).ContainerDuration = 0;
  (this->m_DDesc).AssetID[0] = '\0';
  (this->m_DDesc).AssetID[1] = '\0';
  (this->m_DDesc).AssetID[2] = '\0';
  (this->m_DDesc).AssetID[3] = '\0';
  Rational::Rational(local_24,0x18,1);
  (this->m_DDesc).EditRate = local_24[0];
  return;
}

Assistant:

h__SequenceParser() : m_FramesRead(0)
  {
    memset(&m_DDesc, 0, sizeof(m_DDesc));
    m_DDesc.EditRate = Rational(24,1);
  }